

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

void * tinfl_decompress_mem_to_heap(void *pSrc_buf,size_t src_buf_len,size_t *pOut_len,int flags)

{
  tinfl_status tVar1;
  int iVar2;
  size_t sVar3;
  ulong __size;
  mz_uint8 *pmVar4;
  mz_uint8 *pOut_buf_start;
  long lVar5;
  size_t dst_buf_size;
  size_t src_buf_size;
  tinfl_decompressor decomp;
  size_t local_2b40;
  size_t local_2b38;
  size_t local_2b30;
  tinfl_decompressor local_2b28;
  
  *pOut_len = 0;
  local_2b28.m_state = 0;
  pOut_buf_start = (mz_uint8 *)0x0;
  lVar5 = 0;
  sVar3 = 0;
  local_2b30 = src_buf_len;
  do {
    local_2b38 = local_2b30 - lVar5;
    local_2b40 = sVar3 - *pOut_len;
    pmVar4 = pOut_buf_start + *pOut_len;
    if (pOut_buf_start == (mz_uint8 *)0x0) {
      pmVar4 = (mz_uint8 *)0x0;
    }
    tVar1 = tinfl_decompress(&local_2b28,(mz_uint8 *)(lVar5 + (long)pSrc_buf),&local_2b38,
                             pOut_buf_start,pmVar4,&local_2b40,flags & 0xfffffff9U | 4);
    if (tVar1 == TINFL_STATUS_NEEDS_MORE_INPUT || tVar1 < TINFL_STATUS_DONE) {
LAB_00130013:
      free(pOut_buf_start);
      *pOut_len = 0;
      iVar2 = 1;
    }
    else {
      lVar5 = lVar5 + local_2b38;
      *pOut_len = *pOut_len + local_2b40;
      if (tVar1 == TINFL_STATUS_DONE) {
        iVar2 = 4;
      }
      else {
        __size = sVar3 * 2;
        if (__size < 0x81) {
          __size = 0x80;
        }
        pmVar4 = (mz_uint8 *)realloc(pOut_buf_start,__size);
        if (pmVar4 == (mz_uint8 *)0x0) goto LAB_00130013;
        iVar2 = 0;
        sVar3 = __size;
        pOut_buf_start = pmVar4;
      }
    }
    if (iVar2 != 0) {
      if (iVar2 != 4) {
        pOut_buf_start = (mz_uint8 *)0x0;
      }
      return pOut_buf_start;
    }
  } while( true );
}

Assistant:

void *tinfl_decompress_mem_to_heap(const void *pSrc_buf, size_t src_buf_len, size_t *pOut_len, int flags)
{
  tinfl_decompressor decomp; void *pBuf = NULL, *pNew_buf; size_t src_buf_ofs = 0, out_buf_capacity = 0;
  *pOut_len = 0;
  tinfl_init(&decomp);
  for ( ; ; )
  {
    size_t src_buf_size = src_buf_len - src_buf_ofs, dst_buf_size = out_buf_capacity - *pOut_len, new_out_buf_capacity;
    tinfl_status status = tinfl_decompress(&decomp, (const mz_uint8*)pSrc_buf + src_buf_ofs, &src_buf_size, (mz_uint8*)pBuf, pBuf ? (mz_uint8*)pBuf + *pOut_len : NULL, &dst_buf_size,
      (flags & ~TINFL_FLAG_HAS_MORE_INPUT) | TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF);
    if ((status < 0) || (status == TINFL_STATUS_NEEDS_MORE_INPUT))
    {
      MZ_FREE(pBuf); *pOut_len = 0; return NULL;
    }
    src_buf_ofs += src_buf_size;
    *pOut_len += dst_buf_size;
    if (status == TINFL_STATUS_DONE) break;
    new_out_buf_capacity = out_buf_capacity * 2; if (new_out_buf_capacity < 128) new_out_buf_capacity = 128;
    pNew_buf = MZ_REALLOC(pBuf, new_out_buf_capacity);
    if (!pNew_buf)
    {
      MZ_FREE(pBuf); *pOut_len = 0; return NULL;
    }
    pBuf = pNew_buf; out_buf_capacity = new_out_buf_capacity;
  }
  return pBuf;
}